

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,pstore::repo::external_fixup>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>
          (rule *this,not_null<const_pstore::exchange::import_ns::string_mapping_*> args,
          vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
          *args_1)

{
  context *pcVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  pointer *__ptr;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_38;
  __uniq_ptr_impl<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_>_>
  local_30;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *args_local_1;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> args_local;
  
  pcVar1 = (this->context_).ptr_;
  args_local_1 = args_1;
  args_local = args;
  std::
  make_unique<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,pstore::repo::external_fixup>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>&,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_30,
             (not_null<const_pstore::exchange::import_ns::string_mapping_*> *)&this->context_,
             (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> **
             )&args_local);
  local_38._M_head_impl =
       (rule *)local_30._M_t.
               super__Tuple_impl<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_>_>
               .
               super__Head_base<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_*,_false>
               ._M_head_impl;
  local_30._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_>_>
  .
  super__Head_base<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_*,_false>
  ._M_head_impl =
       (tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_>_>
        )(_Tuple_impl<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_>_>
          )0x0;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)&pcVar1->stack,
             (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
              *)&local_38);
  if (local_38._M_head_impl != (rule *)0x0) {
    (*(local_38._M_head_impl)->_vptr_rule[1])();
  }
  local_38._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>_>_>
                 *)&local_30);
  log_top(this,true);
  uVar3 = std::_V2::system_category();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  return (error_code)(auVar2 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }